

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall QGraphicsItemPrivate::updateSceneTransformFromParent(QGraphicsItemPrivate *this)

{
  double dVar1;
  double dVar2;
  QGraphicsItem *pQVar3;
  QGraphicsItemPrivate *pQVar4;
  TransformData *this_00;
  int iVar5;
  long lVar6;
  ulong uVar7;
  TransformData *pTVar8;
  QTransform *pQVar9;
  QTransform *pQVar10;
  QTransform *pQVar11;
  long in_FS_OFFSET;
  byte bVar12;
  QTransform QStack_88;
  long local_38;
  
  bVar12 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = this->parent;
  if (pQVar3 == (QGraphicsItem *)0x0) {
    this_00 = this->transformData;
    if (this_00 == (TransformData *)0x0) {
      QTransform::fromTranslate((this->pos).xp,(this->pos).yp);
      pQVar9 = &QStack_88;
      pQVar10 = &this->sceneTransform;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        pQVar10->m_matrix[0][0] = *(qreal *)pQVar9;
        pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        pQVar10 = (QTransform *)((long)pQVar10 + (ulong)bVar12 * -0x10 + 8);
      }
      *(undefined2 *)&(this->sceneTransform).field_0x48 = QStack_88._72_2_;
      *(ulong *)&this->field_0x160 = *(ulong *)&this->field_0x160 | 0x4000000000000000;
      goto LAB_005e3bb4;
    }
    if (this_00->onlyTransform == true) {
      pTVar8 = this_00;
      pQVar9 = &this->sceneTransform;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        pQVar9->m_matrix[0][0] = (pTVar8->transform).m_matrix[0][0];
        pTVar8 = (TransformData *)((pTVar8->transform).m_matrix[0] + 1);
        pQVar9 = (QTransform *)(pQVar9->m_matrix[0] + 1);
      }
      *(undefined2 *)&(this->sceneTransform).field_0x48 =
           *(undefined2 *)&(this_00->transform).field_0x48;
      dVar1 = (this->pos).xp;
      dVar2 = (this->pos).yp;
      if (((dVar1 != 0.0) || (NAN(dVar1))) || ((dVar2 != 0.0 || (NAN(dVar2))))) {
        QTransform::fromTranslate(dVar1,dVar2);
        QTransform::operator*=(&this->sceneTransform,&QStack_88);
      }
    }
    else {
      dVar1 = (this->pos).xp;
      dVar2 = (this->pos).yp;
      pQVar9 = &this->sceneTransform;
      if ((((dVar1 == 0.0) && (!NAN(dVar1))) && (dVar2 == 0.0)) && (!NAN(dVar2))) {
        TransformData::computedFullTransform(&QStack_88,this_00,(QTransform *)0x0);
        pQVar10 = &QStack_88;
        for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
          pQVar9->m_matrix[0][0] = *(qreal *)pQVar10;
          pQVar10 = (QTransform *)((long)pQVar10 + ((ulong)bVar12 * -2 + 1) * 8);
          pQVar9 = (QTransform *)((long)pQVar9 + (ulong)bVar12 * -0x10 + 8);
        }
        *(undefined2 *)&(this->sceneTransform).field_0x48 = QStack_88._72_2_;
        iVar5 = QTransform::type();
        uVar7 = 0x4000000000000000;
        if (1 < iVar5) {
          uVar7 = 0;
        }
        goto LAB_005e3ba3;
      }
      QTransform::fromTranslate(dVar1,dVar2);
      pQVar10 = &QStack_88;
      pQVar11 = pQVar9;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        pQVar11->m_matrix[0][0] = *(qreal *)pQVar10;
        pQVar10 = (QTransform *)((long)pQVar10 + ((ulong)bVar12 * -2 + 1) * 8);
        pQVar11 = (QTransform *)((long)pQVar11 + (ulong)bVar12 * -0x10 + 8);
      }
      *(undefined2 *)&(this->sceneTransform).field_0x48 = QStack_88._72_2_;
      TransformData::computedFullTransform(&QStack_88,this->transformData,pQVar9);
      pQVar10 = &QStack_88;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        pQVar9->m_matrix[0][0] = *(qreal *)pQVar10;
        pQVar10 = (QTransform *)((long)pQVar10 + ((ulong)bVar12 * -2 + 1) * 8);
        pQVar9 = (QTransform *)((long)pQVar9 + (ulong)bVar12 * -0x10 + 8);
      }
      *(undefined2 *)&(this->sceneTransform).field_0x48 = QStack_88._72_2_;
    }
LAB_005e3b74:
    iVar5 = QTransform::type();
    uVar7 = 0;
    if (iVar5 < 2) {
      uVar7 = 0x4000000000000000;
    }
    uVar7 = *(ulong *)&this->field_0x160 & 0xbfffffffffffffff | uVar7;
  }
  else {
    pQVar4 = (pQVar3->d_ptr).d;
    if ((*(ulong *)&pQVar4->field_0x160 & 0x4000000000000000) == 0) {
      pQVar9 = &pQVar4->sceneTransform;
      pQVar10 = &this->sceneTransform;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        pQVar10->m_matrix[0][0] = pQVar9->m_matrix[0][0];
        pQVar9 = (QTransform *)(pQVar9->m_matrix[0] + 1);
        pQVar10 = (QTransform *)(pQVar10->m_matrix[0] + 1);
      }
      *(undefined2 *)&(this->sceneTransform).field_0x48 =
           *(undefined2 *)&(pQVar4->sceneTransform).field_0x48;
      QTransform::translate((this->pos).xp,(this->pos).yp);
    }
    else {
      pQVar4 = (pQVar3->d_ptr).d;
      QTransform::fromTranslate
                ((pQVar4->sceneTransform).m_matrix[2][0] + (this->pos).xp,
                 (pQVar4->sceneTransform).m_matrix[2][1] + (this->pos).yp);
      pQVar9 = &QStack_88;
      pQVar10 = &this->sceneTransform;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        pQVar10->m_matrix[0][0] = *(qreal *)pQVar9;
        pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        pQVar10 = (QTransform *)((long)pQVar10 + (ulong)bVar12 * -0x10 + 8);
      }
      *(undefined2 *)&(this->sceneTransform).field_0x48 = QStack_88._72_2_;
    }
    if (this->transformData != (TransformData *)0x0) {
      TransformData::computedFullTransform(&QStack_88,this->transformData,&this->sceneTransform);
      pQVar9 = &QStack_88;
      pQVar10 = &this->sceneTransform;
      for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
        pQVar10->m_matrix[0][0] = *(qreal *)pQVar9;
        pQVar9 = (QTransform *)((long)pQVar9 + ((ulong)bVar12 * -2 + 1) * 8);
        pQVar10 = (QTransform *)((long)pQVar10 + (ulong)bVar12 * -0x10 + 8);
      }
      *(undefined2 *)&(this->sceneTransform).field_0x48 = QStack_88._72_2_;
      goto LAB_005e3b74;
    }
    uVar7 = *(ulong *)&((this->parent->d_ptr).d)->field_0x160 & 0x4000000000000000;
LAB_005e3ba3:
    uVar7 = *(ulong *)&this->field_0x160 & 0xbfffffffffffffff | uVar7;
  }
  *(ulong *)&this->field_0x160 = uVar7;
LAB_005e3bb4:
  this->field_0x166 = this->field_0x166 & 0xdf;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::updateSceneTransformFromParent()
{
    if (parent) {
        Q_ASSERT(!parent->d_ptr->dirtySceneTransform);
        if (parent->d_ptr->sceneTransformTranslateOnly) {
            sceneTransform = QTransform::fromTranslate(parent->d_ptr->sceneTransform.dx() + pos.x(),
                                                       parent->d_ptr->sceneTransform.dy() + pos.y());
        } else {
            sceneTransform = parent->d_ptr->sceneTransform;
            sceneTransform.translate(pos.x(), pos.y());
        }
        if (transformData) {
            sceneTransform = transformData->computedFullTransform(&sceneTransform);
            sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
        } else {
            sceneTransformTranslateOnly = parent->d_ptr->sceneTransformTranslateOnly;
        }
    } else if (!transformData) {
        sceneTransform = QTransform::fromTranslate(pos.x(), pos.y());
        sceneTransformTranslateOnly = 1;
    } else if (transformData->onlyTransform) {
        sceneTransform = transformData->transform;
        if (!pos.isNull())
            sceneTransform *= QTransform::fromTranslate(pos.x(), pos.y());
        sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
    } else if (pos.isNull()) {
        sceneTransform = transformData->computedFullTransform();
        sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
    } else {
        sceneTransform = QTransform::fromTranslate(pos.x(), pos.y());
        sceneTransform = transformData->computedFullTransform(&sceneTransform);
        sceneTransformTranslateOnly = (sceneTransform.type() <= QTransform::TxTranslate);
    }
    dirtySceneTransform = 0;
}